

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O3

void __thiscall pybind11::capsule::capsule(capsule *this,object *o)

{
  PyObject *pPVar1;
  runtime_error *this_00;
  long *plVar2;
  long *plVar3;
  allocator<char> local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  (this->super_object).super_handle.m_ptr = (o->super_handle).m_ptr;
  (o->super_handle).m_ptr = (PyObject *)0x0;
  pPVar1 = (this->super_object).super_handle.m_ptr;
  if ((pPVar1 != (PyObject *)0x0) && (pPVar1->ob_type != (PyTypeObject *)&PyCapsule_Type)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,((this->super_object).super_handle.m_ptr)->ob_type->tp_name,
               &local_89);
    std::operator+(&local_48,"Object of type \'",&local_88);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_48);
    local_68 = (long *)*plVar2;
    plVar3 = plVar2 + 2;
    if (local_68 == plVar3) {
      local_58 = *plVar3;
      lStack_50 = plVar2[3];
      local_68 = &local_58;
    }
    else {
      local_58 = *plVar3;
    }
    local_60 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::runtime_error::runtime_error(this_00,(string *)&local_68);
    *(undefined ***)this_00 = &PTR__runtime_error_0013fb60;
    __cxa_throw(this_00,&type_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

object(object &&other) noexcept : handle(other) { other.m_ptr = nullptr; }